

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atomic64_gcc_x86_64.h
# Opt level: O0

int64_t aeron::concurrent::atomic::cmpxchg(int64_t *destination,int64_t expected,int64_t desired)

{
  long lVar1;
  int64_t original;
  int64_t desired_local;
  int64_t expected_local;
  int64_t *destination_local;
  
  LOCK();
  lVar1 = *destination;
  if (expected == lVar1) {
    *destination = desired;
    lVar1 = expected;
  }
  UNLOCK();
  return lVar1;
}

Assistant:

inline std::int64_t cmpxchg(volatile std::int64_t* destination,  std::int64_t expected, std::int64_t desired)
{
    std::int64_t original;
    asm volatile(
        "lock; cmpxchgq %2, %1"
        : "=a"(original), "+m"(*destination)
        : "q"(desired), "0"(expected));
    return original;
}